

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_small_width_height_test.cc
# Opt level: O3

void anon_unknown.dwarf_15f2760::Encode1x1(aom_img_fmt fmt,int bitdepth,aom_codec_flags_t flags)

{
  uchar *puVar1;
  aom_codec_iface_t *iface;
  undefined8 *puVar2;
  pointer *__ptr;
  SEARCH_METHODS *pSVar3;
  ulong __n;
  aom_codec_ctx_t enc;
  aom_image_t img;
  aom_codec_enc_cfg_t cfg;
  AssertHelper local_4c8;
  AssertHelper local_4c0;
  AssertHelper local_4b8;
  undefined8 *local_4b0;
  _Head_base<0UL,_unsigned_char_*,_false> local_4a8;
  _Head_base<0UL,_unsigned_char_*,_false> local_4a0;
  _Head_base<0UL,_unsigned_char_*,_false> local_498;
  aom_codec_ctx_t local_490;
  aom_image_t local_458;
  aom_codec_enc_cfg_t local_3b0;
  
  memset(&local_458,0,0xa8);
  local_458.w = 1;
  local_458.h = 1;
  local_458.d_w = 1;
  local_458.d_h = 1;
  local_458.x_chroma_shift = 1;
  local_458.y_chroma_shift = 1;
  local_458.bps = 0xc;
  __n = (ulong)(8 < bitdepth) + 1;
  local_458.stride[0] = 1;
  local_458.stride[1] = 1;
  local_458.stride[2] = 1;
  local_458.fmt = fmt;
  local_458.bit_depth = bitdepth;
  puVar1 = (uchar *)operator_new__(__n);
  memset(puVar1,0,__n);
  local_490.name = (char *)0x0;
  local_498._M_head_impl = puVar1;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
            ((internal *)&local_3b0,"y_plane","nullptr",
             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_498,
             &local_490.name);
  if ((char)local_3b0.g_usage == '\0') {
    testing::Message::Message((Message *)&local_490);
    if ((undefined8 *)CONCAT44(local_3b0.g_w,local_3b0.g_profile) == (undefined8 *)0x0) {
      pSVar3 = "";
    }
    else {
      pSVar3 = *(SEARCH_METHODS **)CONCAT44(local_3b0.g_w,local_3b0.g_profile);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0xd6,(char *)pSVar3);
    testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_490);
    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
    if ((long *)local_490.name != (long *)0x0) {
      (**(code **)(*(long *)local_490.name + 8))();
    }
    puVar2 = (undefined8 *)CONCAT44(local_3b0.g_w,local_3b0.g_profile);
    if (puVar2 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar2 != puVar2 + 2) {
        operator_delete((undefined8 *)*puVar2);
      }
      operator_delete(puVar2);
    }
  }
  else {
    puVar2 = (undefined8 *)CONCAT44(local_3b0.g_w,local_3b0.g_profile);
    if (puVar2 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar2 != puVar2 + 2) {
        operator_delete((undefined8 *)*puVar2);
      }
      operator_delete(puVar2);
    }
    puVar1 = (uchar *)operator_new__(__n);
    memset(puVar1,0,__n);
    local_490.name = (char *)0x0;
    local_4a0._M_head_impl = puVar1;
    testing::internal::
    CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
              ((internal *)&local_3b0,"u_plane","nullptr",
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_4a0,
               &local_490.name);
    if ((char)local_3b0.g_usage == '\0') {
      testing::Message::Message((Message *)&local_490);
      if ((undefined8 *)CONCAT44(local_3b0.g_w,local_3b0.g_profile) == (undefined8 *)0x0) {
        pSVar3 = "";
      }
      else {
        pSVar3 = *(SEARCH_METHODS **)CONCAT44(local_3b0.g_w,local_3b0.g_profile);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                 ,0xd9,(char *)pSVar3);
      testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_490);
      testing::internal::AssertHelper::~AssertHelper(&local_4b8);
      if ((long *)local_490.name != (long *)0x0) {
        (**(code **)(*(long *)local_490.name + 8))();
      }
      puVar2 = (undefined8 *)CONCAT44(local_3b0.g_w,local_3b0.g_profile);
      if (puVar2 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar2 != puVar2 + 2) {
          operator_delete((undefined8 *)*puVar2);
        }
        operator_delete(puVar2);
      }
    }
    else {
      puVar2 = (undefined8 *)CONCAT44(local_3b0.g_w,local_3b0.g_profile);
      if (puVar2 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar2 != puVar2 + 2) {
          operator_delete((undefined8 *)*puVar2);
        }
        operator_delete(puVar2);
      }
      puVar1 = (uchar *)operator_new__(__n);
      memset(puVar1,0,__n);
      local_490.name = (char *)0x0;
      local_4a8._M_head_impl = puVar1;
      testing::internal::
      CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
                ((internal *)&local_3b0,"v_plane","nullptr",
                 (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_4a8,
                 &local_490.name);
      if ((char)local_3b0.g_usage == '\0') {
        testing::Message::Message((Message *)&local_490);
        if ((undefined8 *)CONCAT44(local_3b0.g_w,local_3b0.g_profile) == (undefined8 *)0x0) {
          pSVar3 = "";
        }
        else {
          pSVar3 = *(SEARCH_METHODS **)CONCAT44(local_3b0.g_w,local_3b0.g_profile);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                   ,0xdc,(char *)pSVar3);
        testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_490);
        testing::internal::AssertHelper::~AssertHelper(&local_4b8);
        if ((long *)local_490.name != (long *)0x0) {
          (**(code **)(*(long *)local_490.name + 8))();
        }
        puVar2 = (undefined8 *)CONCAT44(local_3b0.g_w,local_3b0.g_profile);
      }
      else {
        puVar2 = (undefined8 *)CONCAT44(local_3b0.g_w,local_3b0.g_profile);
        if (puVar2 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar2 != puVar2 + 2) {
            operator_delete((undefined8 *)*puVar2);
          }
          operator_delete(puVar2);
        }
        local_458.planes[0] = local_498._M_head_impl;
        local_458.planes[1] = local_4a0._M_head_impl;
        local_458.planes[2] = local_4a8._M_head_impl;
        iface = aom_codec_av1_cx();
        local_4b8.data_._0_4_ = 0;
        local_4c8.data_._0_4_ = aom_codec_enc_config_default(iface,&local_3b0,0);
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&local_490,"AOM_CODEC_OK",
                   "aom_codec_enc_config_default(iface, &cfg, kUsage)",(aom_codec_err_t *)&local_4b8
                   ,(aom_codec_err_t *)&local_4c8);
        if ((char)local_490.name == '\0') {
          testing::Message::Message((Message *)&local_4b8);
          if (local_490.iface == (aom_codec_iface_t *)0x0) {
            pSVar3 = "";
          }
          else {
            pSVar3 = (SEARCH_METHODS *)(local_490.iface)->name;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                     ,0xe3,(char *)pSVar3);
          testing::internal::AssertHelper::operator=(&local_4c8,(Message *)&local_4b8);
          testing::internal::AssertHelper::~AssertHelper(&local_4c8);
          if ((long *)CONCAT44(local_4b8.data_._4_4_,local_4b8.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_4b8.data_._4_4_,local_4b8.data_._0_4_) + 8))();
          }
        }
        if (local_490.iface != (aom_codec_iface_t *)0x0) {
          if ((aom_codec_caps_t *)(local_490.iface)->name != &(local_490.iface)->caps) {
            operator_delete((local_490.iface)->name);
          }
          operator_delete(local_490.iface);
        }
        local_3b0.g_w = 1;
        local_3b0.g_h = 1;
        local_4c8.data_._0_4_ = 0;
        local_4c0.data_._0_4_ = aom_codec_enc_init_ver(&local_490,iface,&local_3b0,flags,0x1d);
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&local_4b8,"AOM_CODEC_OK",
                   "aom_codec_enc_init_ver(&enc, iface, &cfg, flags, (10 + (7 + (9)) + 3))",
                   (aom_codec_err_t *)&local_4c8,(aom_codec_err_t *)&local_4c0);
        if (local_4b8.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_4c8);
          if (local_4b0 == (undefined8 *)0x0) {
            pSVar3 = "";
          }
          else {
            pSVar3 = (SEARCH_METHODS *)*local_4b0;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                     ,0xe7,(char *)pSVar3);
          testing::internal::AssertHelper::operator=(&local_4c0,(Message *)&local_4c8);
          testing::internal::AssertHelper::~AssertHelper(&local_4c0);
          if ((long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) +
                        8))();
          }
        }
        puVar2 = local_4b0;
        if (local_4b0 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_4b0 != local_4b0 + 2) {
            operator_delete((undefined8 *)*local_4b0);
          }
          operator_delete(puVar2);
        }
        local_4c8.data_._0_4_ = 0;
        local_4c0.data_._0_4_ = aom_codec_control(&local_490,0xd,5);
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&local_4b8,"AOM_CODEC_OK",
                   "aom_codec_control(&enc, AOME_SET_CPUUSED, 5)",(aom_codec_err_t *)&local_4c8,
                   (aom_codec_err_t *)&local_4c0);
        if (local_4b8.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_4c8);
          if (local_4b0 == (undefined8 *)0x0) {
            pSVar3 = "";
          }
          else {
            pSVar3 = (SEARCH_METHODS *)*local_4b0;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                     ,0xe8,(char *)pSVar3);
          testing::internal::AssertHelper::operator=(&local_4c0,(Message *)&local_4c8);
          testing::internal::AssertHelper::~AssertHelper(&local_4c0);
          if ((long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) +
                        8))();
          }
        }
        puVar2 = local_4b0;
        if (local_4b0 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_4b0 != local_4b0 + 2) {
            operator_delete((undefined8 *)*local_4b0);
          }
          operator_delete(puVar2);
        }
        local_4c8.data_._0_4_ = 0;
        local_4c0.data_._0_4_ = aom_codec_encode(&local_490,&local_458,0,1,0);
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&local_4b8,"AOM_CODEC_OK","aom_codec_encode(&enc, &img, 0, 1, 0)",
                   (aom_codec_err_t *)&local_4c8,(aom_codec_err_t *)&local_4c0);
        if (local_4b8.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_4c8);
          if (local_4b0 == (undefined8 *)0x0) {
            pSVar3 = "";
          }
          else {
            pSVar3 = (SEARCH_METHODS *)*local_4b0;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                     ,0xe9,(char *)pSVar3);
          testing::internal::AssertHelper::operator=(&local_4c0,(Message *)&local_4c8);
          testing::internal::AssertHelper::~AssertHelper(&local_4c0);
          if ((long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) +
                        8))();
          }
        }
        puVar2 = local_4b0;
        if (local_4b0 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_4b0 != local_4b0 + 2) {
            operator_delete((undefined8 *)*local_4b0);
          }
          operator_delete(puVar2);
        }
        local_4c8.data_._0_4_ = 0;
        local_4c0.data_._0_4_ = aom_codec_encode(&local_490,(aom_image_t *)0x0,0,0,0);
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&local_4b8,"AOM_CODEC_OK","aom_codec_encode(&enc, nullptr, 0, 0, 0)",
                   (aom_codec_err_t *)&local_4c8,(aom_codec_err_t *)&local_4c0);
        if (local_4b8.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_4c8);
          if (local_4b0 == (undefined8 *)0x0) {
            pSVar3 = "";
          }
          else {
            pSVar3 = (SEARCH_METHODS *)*local_4b0;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                     ,0xea,(char *)pSVar3);
          testing::internal::AssertHelper::operator=(&local_4c0,(Message *)&local_4c8);
          testing::internal::AssertHelper::~AssertHelper(&local_4c0);
          if ((long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) +
                        8))();
          }
        }
        puVar2 = local_4b0;
        if (local_4b0 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_4b0 != local_4b0 + 2) {
            operator_delete((undefined8 *)*local_4b0);
          }
          operator_delete(puVar2);
        }
        local_4c8.data_._0_4_ = 0;
        local_4c0.data_._0_4_ = aom_codec_destroy(&local_490);
        testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                  ((internal *)&local_4b8,"AOM_CODEC_OK","aom_codec_destroy(&enc)",
                   (aom_codec_err_t *)&local_4c8,(aom_codec_err_t *)&local_4c0);
        puVar2 = local_4b0;
        if (local_4b8.data_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_4c8);
          if (local_4b0 == (undefined8 *)0x0) {
            pSVar3 = "";
          }
          else {
            pSVar3 = (SEARCH_METHODS *)*local_4b0;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
                     ,0xeb,(char *)pSVar3);
          testing::internal::AssertHelper::operator=(&local_4c0,(Message *)&local_4c8);
          testing::internal::AssertHelper::~AssertHelper(&local_4c0);
          puVar2 = local_4b0;
          if ((long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_4c8.data_._4_4_,(aom_codec_err_t)local_4c8.data_) +
                        8))();
            puVar2 = local_4b0;
          }
        }
      }
      if (puVar2 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar2 != puVar2 + 2) {
          operator_delete((undefined8 *)*puVar2);
        }
        operator_delete(puVar2);
      }
      if (local_4a8._M_head_impl != (uchar *)0x0) {
        operator_delete__(local_4a8._M_head_impl);
      }
    }
    if (local_4a0._M_head_impl != (uchar *)0x0) {
      operator_delete__(local_4a0._M_head_impl);
    }
  }
  if (local_498._M_head_impl != (uchar *)0x0) {
    operator_delete__(local_498._M_head_impl);
  }
  return;
}

Assistant:

void Encode1x1(aom_img_fmt fmt, int bitdepth, aom_codec_flags_t flags) {
  constexpr int kWidth = 1;
  constexpr int kHeight = 1;

  // This test cannot use aom_img_alloc() or aom_img_wrap() because they call
  // align_image_dimension() to align img.w and img.h to the next even number
  // (2). In this test it is important to set img.w and img.h to 1. Therefore we
  // set up img manually.
  aom_image_t img;
  memset(&img, 0, sizeof(img));
  img.fmt = fmt;
  img.bit_depth = bitdepth;
  img.w = kWidth;
  img.h = kHeight;
  img.d_w = kWidth;
  img.d_h = kHeight;
  img.x_chroma_shift = 1;
  img.y_chroma_shift = 1;
  img.bps = 12;
  const int y_stride = kWidth;
  const int uv_stride = (kWidth + 1) >> 1;
  int y_height = kHeight;
  int uv_height = (kHeight + 1) >> 1;
  if (bitdepth > 8) {
    y_height <<= 1;
    uv_height <<= 1;
  }
  img.stride[AOM_PLANE_Y] = y_stride;
  img.stride[AOM_PLANE_U] = img.stride[AOM_PLANE_V] = uv_stride;
  std::unique_ptr<unsigned char[]> y_plane(
      new unsigned char[y_height * y_stride]());
  ASSERT_NE(y_plane, nullptr);
  std::unique_ptr<unsigned char[]> u_plane(
      new unsigned char[uv_height * uv_stride]());
  ASSERT_NE(u_plane, nullptr);
  std::unique_ptr<unsigned char[]> v_plane(
      new unsigned char[uv_height * uv_stride]());
  ASSERT_NE(v_plane, nullptr);
  img.planes[AOM_PLANE_Y] = y_plane.get();
  img.planes[AOM_PLANE_U] = u_plane.get();
  img.planes[AOM_PLANE_V] = v_plane.get();

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_config_default(iface, &cfg, kUsage));
  cfg.g_w = kWidth;
  cfg.g_h = kHeight;
  aom_codec_ctx_t enc;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_init(&enc, iface, &cfg, flags));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_control(&enc, AOME_SET_CPUUSED, 5));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, &img, 0, 1, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, nullptr, 0, 0, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc));
}